

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bit_cost_t __thiscall
lzham::lzcompressor::state::get_cost
          (state *this,CLZBase *lzbase,search_accelerator *dict,lzdecision *lzdec)

{
  ushort uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  char *pcVar5;
  bit_cost_t bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int limit;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  
  uVar2 = lzdec->m_pos;
  iVar11 = uVar2 - this->m_block_start_dict_ofs;
  if (iVar11 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)(dict->m_dict).m_p[uVar2 - 1];
  }
  uVar8 = (this->super_state_base).m_cur_state;
  uVar9 = (ulong)uVar8;
  uVar12 = lzdec->m_len;
  lVar13 = (long)(int)uVar12;
  uVar1 = *(ushort *)
           ((long)(&this->super_state_base + 1) + (ulong)(uVar8 << 6 | uVar4 >> 2) * 2 + 4);
  uVar15 = 0x800 - uVar1;
  if (lVar13 < 1) {
    uVar15 = (uint)uVar1;
  }
  uVar14 = (ulong)*(uint *)(gProbCost + (ulong)uVar15 * 4);
  if (lVar13 < 1) {
    puVar3 = (dict->m_dict).m_p;
    bVar7 = puVar3[uVar2];
    if (uVar8 < 7) {
      uVar8 = 0;
      if (1 < iVar11) {
        uVar8 = puVar3[uVar2 - 2] >> 2 & 0x38;
      }
      pcVar5 = this->m_lit_table[0].m_unused_alignment + ((ulong)((uVar4 >> 5 | uVar8) << 7) - 0x30)
      ;
    }
    else {
      uVar4 = (this->super_state_base).m_match_hist[0];
      bVar7 = bVar7 ^ puVar3[uVar2 - uVar4 & dict->m_max_dict_size_mask];
      pcVar5 = this->m_delta_lit_table[0].m_unused_alignment +
               ((ulong)(((uint)(puVar3[uVar2 - uVar4 & dict->m_max_dict_size_mask] >> 5) +
                        (uint)(puVar3[~uVar4 + uVar2 & dict->m_max_dict_size_mask] >> 5) * 8) * 0x80
                       ) - 0x30);
    }
    return (long)(int)((uint)*(byte *)(*(long *)pcVar5 + (ulong)bVar7) << 0x18) + uVar14;
  }
  uVar2 = lzdec->m_dist;
  uVar1 = *(ushort *)((long)this->m_lit_table + uVar9 * 2 + -0x7c);
  if ((int)uVar2 < 0) {
    if (uVar2 == 0xffffffff) {
      lVar10 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4) + uVar14 +
               (ulong)*(uint *)(gProbCost +
                               (ulong)(0x800 - *(ushort *)
                                                ((long)this->m_lit_table + uVar9 * 2 + -100)) * 4);
      uVar1 = *(ushort *)((long)this->m_lit_table + uVar9 * 2 + -0x4c);
      if (uVar12 != 1) {
        lVar13 = (long)(int)((uint)this->m_rep_len_table[6 < uVar8].
                                   super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                   [lVar13 + -2] << 0x18) +
                 (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
        goto LAB_0010b57c;
      }
      uVar9 = (ulong)(0x800 - uVar1);
LAB_0010b49f:
      uVar2 = *(uint *)(gProbCost + uVar9 * 4);
    }
    else {
      lVar10 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4) + uVar14 +
               (ulong)*(uint *)(gProbCost +
                               (ulong)*(ushort *)((long)this->m_lit_table + uVar9 * 2 + -100) * 4) +
               (long)(int)((uint)this->m_rep_len_table[6 < uVar8].
                                 super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                 [uVar12 - 2] << 0x18);
      uVar1 = *(ushort *)((long)this->m_lit_table + uVar9 * 2 + -0x34);
      if (uVar2 != 0xfffffffe) {
        lVar10 = lVar10 + (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
        uVar1 = *(ushort *)(this->m_lit_table[0].m_unused_alignment + uVar9 * 2 + -0x6c);
        uVar9 = (ulong)uVar1;
        if (uVar2 != 0xfffffffd) goto LAB_0010b49f;
      }
      uVar2 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4);
    }
    bVar6 = lVar10 + (ulong)uVar2;
  }
  else {
    if (uVar2 < 0x1000) {
      uVar4 = (uint)lzbase->m_slot_tab0[uVar2];
    }
    else if (uVar2 < 0x100000) {
      uVar4 = (uint)lzbase->m_slot_tab1[uVar2 >> 0xb];
    }
    else if (uVar2 < 0x1000000) {
      uVar4 = (uint)lzbase->m_slot_tab2[uVar2 >> 0x10];
    }
    else if (uVar2 < 0x2000000) {
      uVar4 = (uVar2 - 0x1000000 >> 0x17) + 0x30;
    }
    else if (uVar2 < 0x4000000) {
      uVar4 = (uVar2 + 0xfe000000 >> 0x18) + 0x32;
    }
    else {
      uVar4 = (uVar2 + 0xfc000000 >> 0x19) + 0x34;
    }
    lVar10 = *(uint *)(gProbCost + (ulong)uVar1 * 4) + uVar14;
    if (uVar12 < 9) {
      uVar12 = uVar12 - 2;
    }
    else {
      lVar10 = lVar10 + (int)((uint)this->m_large_len_table[6 < uVar8].
                                    super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                    [lVar13 + -9] << 0x18);
      uVar12 = 7;
    }
    lVar10 = (int)((uint)(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model.
                         m_code_sizes.m_p[(uVar4 * 8 - 8 | uVar12) + 2] << 0x18) + lVar10;
    bVar7 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[uVar4];
    if (2 < bVar7) {
      uVar9 = 0;
      if (4 < bVar7) {
        uVar9 = (ulong)((uint)bVar7 * 0x1000000 + 0xfc000000);
      }
      return (long)(int)((uint)(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model.
                               m_code_sizes.m_p
                               [(lzbase->super_CLZDecompBase).m_lzx_position_extra_mask[uVar4] &
                                uVar2 - (lzbase->super_CLZDecompBase).m_lzx_position_base[uVar4] &
                                0xf] << 0x18) + uVar9 + lVar10;
    }
    lVar13 = (ulong)bVar7 << 0x18;
LAB_0010b57c:
    bVar6 = lVar10 + lVar13;
  }
  return bVar6;
}

Assistant:

bit_cost_t lzcompressor::state::get_cost(CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec) const
   {
      const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, m_cur_state);
      LZHAM_ASSERT(is_match_model_index < LZHAM_ARRAY_SIZE(m_is_match_model));
      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(lzdec.is_match());

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            const uint lit_pred1 = get_pred_char(dict, lzdec.m_pos, 2);

            uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
                            (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

            // literal
            cost += m_lit_table[lit_pred].get_cost(lit);
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            const uint rep_lit1 = dict[(lzdec.m_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

            uint delta_lit = rep_lit0 ^ lit;

            uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
                            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

            cost += m_delta_lit_table[lit_pred].get_cost(delta_lit);
         }
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            cost += m_is_rep_model[m_cur_state].get_cost(1);

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               cost += m_is_rep0_model[m_cur_state].get_cost(1);

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(1);
               }
               else
               {
                  // normal rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(0);

                  cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);
               }
            }
            else
            {
               cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);

               // rep1-rep3 match
               cost += m_is_rep0_model[m_cur_state].get_cost(0);

               if (match_hist_index == 1)
               {
                  // rep1
                  cost += m_is_rep1_model[m_cur_state].get_cost(1);
               }
               else
               {
                  cost += m_is_rep1_model[m_cur_state].get_cost(0);

                  if (match_hist_index == 2)
                  {
                     // rep2
                     cost += m_is_rep2_model[m_cur_state].get_cost(1);
                  }
                  else
                  {
                     LZHAM_ASSERT(match_hist_index == 3);
                     // rep3
                     cost += m_is_rep2_model[m_cur_state].get_cost(0);
                  }
               }
            }
         }
         else
         {
            cost += m_is_rep_model[m_cur_state].get_cost(0);

            LZHAM_ASSERT(lzdec.m_len >= cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;
               cost += m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - 9);
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
               cost += (num_extra_bits << cBitCostScaleShift);
            else
            {
               if (num_extra_bits > 4)
                  cost += ((num_extra_bits - 4) << cBitCostScaleShift);

               cost += m_dist_lsb_table.get_cost(match_extra & 15);
            }
         }
      }

      return cost;
   }